

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O2

EStatusCode __thiscall
EncryptionHelper::Setup(EncryptionHelper *this,DecryptionHelper *inDecryptionSource)

{
  XCryptionCommon *pXVar1;
  bool bVar2;
  uint uVar3;
  longlong lVar4;
  ByteList *pBVar5;
  StringToXCryptionCommonMap *pSVar6;
  XCryptionCommon *this_00;
  XCryptionCommon *pXVar7;
  _Base_ptr p_Var8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
  local_58;
  
  bVar2 = DecryptionHelper::IsEncrypted(inDecryptionSource);
  if (bVar2) {
    bVar2 = DecryptionHelper::CanDecryptDocument(inDecryptionSource);
    if (bVar2) {
      this->mIsDocumentEncrypted = false;
      this->mSupportsEncryption = false;
      uVar3 = DecryptionHelper::GetLength(inDecryptionSource);
      this->mLength = uVar3;
      uVar3 = DecryptionHelper::GetV(inDecryptionSource);
      this->mV = uVar3;
      uVar3 = DecryptionHelper::GetRevision(inDecryptionSource);
      this->mRevision = uVar3;
      lVar4 = DecryptionHelper::GetP(inDecryptionSource);
      this->mP = lVar4;
      bVar2 = DecryptionHelper::GetEncryptMetaData(inDecryptionSource);
      this->mEncryptMetaData = bVar2;
      pBVar5 = DecryptionHelper::GetFileIDPart1_abi_cxx11_(inDecryptionSource);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->mFileIDPart1,pBVar5);
      pBVar5 = DecryptionHelper::GetO_abi_cxx11_(inDecryptionSource);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mO,pBVar5)
      ;
      pBVar5 = DecryptionHelper::GetU_abi_cxx11_(inDecryptionSource);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mU,pBVar5)
      ;
      this->mXcryptStreams = (XCryptionCommon *)0x0;
      this->mXcryptStrings = (XCryptionCommon *)0x0;
      this->mXcryptAuthentication = (XCryptionCommon *)0x0;
      pSVar6 = DecryptionHelper::GetXcrypts_abi_cxx11_(inDecryptionSource);
      p_Var8 = (pSVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pSVar6 = DecryptionHelper::GetXcrypts_abi_cxx11_(inDecryptionSource);
      for (; (_Rb_tree_header *)p_Var8 != &(pSVar6->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        this_00 = (XCryptionCommon *)operator_new(0x58);
        XCryptionCommon::XCryptionCommon(this_00);
        bVar2 = XCryptionCommon::IsUsingAES(*(XCryptionCommon **)(p_Var8 + 2));
        XCryptionCommon::Setup(this_00,bVar2);
        pBVar5 = XCryptionCommon::GetInitialEncryptionKey_abi_cxx11_
                           (*(XCryptionCommon **)(p_Var8 + 2));
        XCryptionCommon::SetupInitialEncryptionKey(this_00,pBVar5);
        std::__cxx11::string::string((string *)&local_58,(string *)(p_Var8 + 1));
        local_58.second = this_00;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                    *)&this->mXcrypts,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pXVar1 = *(XCryptionCommon **)(p_Var8 + 2);
        pXVar7 = DecryptionHelper::GetStreamXcrypt(inDecryptionSource);
        if (pXVar1 == pXVar7) {
          this->mXcryptStreams = this_00;
        }
        pXVar1 = *(XCryptionCommon **)(p_Var8 + 2);
        pXVar7 = DecryptionHelper::GetStringXcrypt(inDecryptionSource);
        if (pXVar1 == pXVar7) {
          this->mXcryptStrings = this_00;
        }
        pXVar1 = *(XCryptionCommon **)(p_Var8 + 2);
        pXVar7 = DecryptionHelper::GetAuthenticationXcrypt(inDecryptionSource);
        if (pXVar1 == pXVar7) {
          this->mXcryptAuthentication = this_00;
        }
      }
      this->mIsDocumentEncrypted = true;
      goto LAB_001861fd;
    }
  }
  this->mIsDocumentEncrypted = false;
LAB_001861fd:
  this->mSupportsEncryption = true;
  return eSuccess;
}

Assistant:

EStatusCode EncryptionHelper::Setup(const DecryptionHelper& inDecryptionSource) 
{
	if (!inDecryptionSource.IsEncrypted() || !inDecryptionSource.CanDecryptDocument()) {
		SetupNoEncryption();
		return eSuccess;
	}

	mIsDocumentEncrypted = false;
	mSupportsEncryption = false;

	do {

		mLength = inDecryptionSource.GetLength();
		mV = inDecryptionSource.GetV();
		mRevision = inDecryptionSource.GetRevision();
		mP = inDecryptionSource.GetP();
		mEncryptMetaData = inDecryptionSource.GetEncryptMetaData();
		mFileIDPart1 = inDecryptionSource.GetFileIDPart1();
		mO = inDecryptionSource.GetO();
		mU = inDecryptionSource.GetU();

		// initialize xcryptors
		mXcryptStreams = NULL;
		// xcrypt to use for strings
		mXcryptStrings = NULL;
		// xcrypt to use for password authentication
		mXcryptAuthentication = NULL;
		StringToXCryptionCommonMap::const_iterator it = inDecryptionSource.GetXcrypts().begin();
		StringToXCryptionCommonMap::const_iterator itEnd = inDecryptionSource.GetXcrypts().end();
		for (; it != itEnd; ++it) {
			XCryptionCommon* xCryption = new XCryptionCommon();
			xCryption->Setup(it->second->IsUsingAES());
			xCryption->SetupInitialEncryptionKey(it->second->GetInitialEncryptionKey());
			mXcrypts.insert(StringToXCryptionCommonMap::value_type(it->first, xCryption));

			// see if it fits any of the global xcryptors
			if (it->second == inDecryptionSource.GetStreamXcrypt())
				mXcryptStreams = xCryption;
			if (it->second == inDecryptionSource.GetStringXcrypt())
				mXcryptStrings = xCryption;
			if (it->second == inDecryptionSource.GetAuthenticationXcrypt())
				mXcryptAuthentication = xCryption;
		}


		mIsDocumentEncrypted = true;
		mSupportsEncryption = true;
	} while (false);

	return eSuccess;
}